

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall duckdb::LocalTableStorage::FlushBlocks(LocalTableStorage *this)

{
  shared_ptr<duckdb::RowGroupCollection,_true> *this_00;
  ulong uVar1;
  RowGroupCollection *pRVar2;
  idx_t iVar3;
  type row_groups;
  
  this_00 = &this->row_groups;
  pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  if (this->merged_storage == false) {
    uVar1 = pRVar2->row_group_size;
    pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
    iVar3 = RowGroupCollection::GetTotalRows(pRVar2);
    if (uVar1 < iVar3) {
      row_groups = shared_ptr<duckdb::RowGroupCollection,_true>::operator*(this_00);
      OptimisticDataWriter::WriteLastRowGroup(&this->optimistic_writer,row_groups);
    }
  }
  OptimisticDataWriter::FinalFlush(&this->optimistic_writer);
  return;
}

Assistant:

void LocalTableStorage::FlushBlocks() {
	const idx_t row_group_size = row_groups->GetRowGroupSize();
	if (!merged_storage && row_groups->GetTotalRows() > row_group_size) {
		optimistic_writer.WriteLastRowGroup(*row_groups);
	}
	optimistic_writer.FinalFlush();
}